

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O1

int32_t zng_deflateReset(zng_stream *strm)

{
  deflate_state *s;
  int32_t iVar1;
  
  iVar1 = zng_deflateResetKeep(strm);
  if (iVar1 == 0) {
    s = strm->state;
    s->window_size = s->w_size * 2;
    memset(s->head,0,0x20000);
    lm_set_level(s,s->level);
    s->lookahead = 0;
    s->insert = 0;
    s->ins_h = 0;
    s->block_start = 0;
    s->match_available = 0;
    s->strstart = 0;
    s->match_start = 0;
    s->prev_length = 0;
  }
  return iVar1;
}

Assistant:

int32_t Z_EXPORT PREFIX(deflateReset)(PREFIX3(stream) *strm) {
    int ret = PREFIX(deflateResetKeep)(strm);
    if (ret == Z_OK)
        lm_init(strm->state);
    return ret;
}